

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_json.c
# Opt level: O3

void write_safe_str(FIOBJ dest,FIOBJ str)

{
  char *pcVar1;
  byte bVar2;
  char cVar3;
  ulong uVar4;
  ulong uVar5;
  fiobj_object_vtable_s *pfVar6;
  uint uVar7;
  ulong uVar8;
  char cVar9;
  long lVar10;
  size_t sVar11;
  ulong uVar12;
  char *pcVar13;
  size_t size;
  ulong uVar14;
  uint uVar15;
  fio_str_info_s ret_4;
  fio_str_info_s t;
  fio_str_info_s s;
  fio_str_info_s local_a8;
  fio_str_info_s local_88;
  fio_str_info_s local_68;
  char *local_48;
  ulong local_40;
  long local_38;
  
  if (str == 0) {
LAB_001622b9:
    local_68.data = anon_var_dwarf_20c;
    local_68.len._0_4_ = 4;
    goto LAB_001622cc;
  }
  cVar9 = (char)str;
  if ((str & 1) == 0) {
    switch((uint)str & 6) {
    case 0:
      cVar9 = *(char *)(str & 0xfffffffffffffff8);
LAB_0016224a:
      switch(cVar9) {
      case '\'':
        pfVar6 = &FIOBJECT_VTABLE_FLOAT;
        break;
      case '(':
        goto switchD_0016223f_caseD_2;
      case ')':
        pfVar6 = &FIOBJECT_VTABLE_ARRAY;
        break;
      case '*':
        goto switchD_0016223f_caseD_4;
      case '+':
        pfVar6 = &FIOBJECT_VTABLE_DATA;
        break;
      default:
        pfVar6 = &FIOBJECT_VTABLE_NUMBER;
      }
      break;
    case 2:
switchD_0016223f_caseD_2:
      pfVar6 = &FIOBJECT_VTABLE_STRING;
      break;
    case 4:
switchD_0016223f_caseD_4:
      pfVar6 = &FIOBJECT_VTABLE_HASH;
      break;
    case 6:
      if (cVar9 == '&') {
        local_68.data = anon_var_dwarf_217;
        local_68.len._0_4_ = 5;
      }
      else {
        uVar7 = (uint)str & 0xff;
        if (uVar7 != 0x16) {
          if (uVar7 == 6) goto LAB_001622b9;
          goto LAB_0016224a;
        }
        local_68.data = anon_var_dwarf_222;
        local_68.len._0_4_ = 4;
      }
LAB_001622cc:
      local_68.capa._0_4_ = 0;
      local_68.capa._4_4_ = 0;
      local_68.len._4_4_ = 0;
      goto LAB_001622d1;
    }
    (*pfVar6->to_str)(&local_68,str);
  }
  else {
    fio_ltocstr(&local_68,(long)str >> 1);
  }
LAB_001622d1:
  cVar9 = (char)dest;
  uVar7 = (uint)dest;
  lVar10 = (long)dest >> 1;
  if (dest == 0) {
LAB_00162370:
    local_88.data = anon_var_dwarf_20c;
    uVar15 = 4;
    goto LAB_00162383;
  }
  if ((dest & 1) == 0) {
    switch(uVar7 & 6) {
    case 0:
      cVar3 = *(char *)(dest & 0xfffffffffffffff8);
LAB_001622fd:
      switch(cVar3) {
      case '\'':
        pfVar6 = &FIOBJECT_VTABLE_FLOAT;
        break;
      case '(':
        goto switchD_001622f2_caseD_2;
      case ')':
        pfVar6 = &FIOBJECT_VTABLE_ARRAY;
        break;
      case '*':
        goto switchD_001622f2_caseD_4;
      case '+':
        pfVar6 = &FIOBJECT_VTABLE_DATA;
        break;
      default:
        pfVar6 = &FIOBJECT_VTABLE_NUMBER;
      }
      break;
    case 2:
switchD_001622f2_caseD_2:
      pfVar6 = &FIOBJECT_VTABLE_STRING;
      break;
    case 4:
switchD_001622f2_caseD_4:
      pfVar6 = &FIOBJECT_VTABLE_HASH;
      break;
    case 6:
      if (cVar9 == '&') {
        local_88.data = anon_var_dwarf_217;
        uVar15 = 5;
      }
      else {
        if ((uVar7 & 0xff) != 0x16) {
          cVar3 = cVar9;
          if ((uVar7 & 0xff) == 6) goto LAB_00162370;
          goto LAB_001622fd;
        }
        local_88.data = anon_var_dwarf_222;
        uVar15 = 4;
      }
LAB_00162383:
      local_88.capa = 0;
      local_88.len = (size_t)uVar15;
      goto LAB_00162388;
    }
    (*pfVar6->to_str)(&local_88,dest);
  }
  else {
    fio_ltocstr(&local_88,lVar10);
  }
LAB_00162388:
  local_88.data[local_88.len] = '\"';
  local_88.len = local_88.len + 1;
  fiobj_str_resize(dest,local_88.len);
  if (dest == 0) {
LAB_00162446:
    local_a8.data = anon_var_dwarf_20c;
    local_a8.len._0_4_ = 4;
    goto LAB_00162459;
  }
  if ((dest & 1) == 0) {
    switch(uVar7 & 6) {
    case 0:
      cVar3 = *(char *)(dest & 0xfffffffffffffff8);
LAB_001623d7:
      switch(cVar3) {
      case '\'':
        pfVar6 = &FIOBJECT_VTABLE_FLOAT;
        break;
      case '(':
        goto switchD_001623cc_caseD_2;
      case ')':
        pfVar6 = &FIOBJECT_VTABLE_ARRAY;
        break;
      case '*':
        goto switchD_001623cc_caseD_4;
      case '+':
        pfVar6 = &FIOBJECT_VTABLE_DATA;
        break;
      default:
        pfVar6 = &FIOBJECT_VTABLE_NUMBER;
      }
      break;
    case 2:
switchD_001623cc_caseD_2:
      pfVar6 = &FIOBJECT_VTABLE_STRING;
      break;
    case 4:
switchD_001623cc_caseD_4:
      pfVar6 = &FIOBJECT_VTABLE_HASH;
      break;
    case 6:
      if (cVar9 == '&') {
        local_a8.data = anon_var_dwarf_217;
        local_a8.len._0_4_ = 5;
      }
      else {
        if ((uVar7 & 0xff) != 0x16) {
          cVar3 = cVar9;
          if ((uVar7 & 0xff) == 6) goto LAB_00162446;
          goto LAB_001623d7;
        }
        local_a8.data = anon_var_dwarf_222;
        local_a8.len._0_4_ = 4;
      }
LAB_00162459:
      local_a8.capa._0_4_ = 0;
      local_a8.capa._4_4_ = 0;
      local_a8.len._4_4_ = 0;
      goto LAB_0016245d;
    }
    (*pfVar6->to_str)(&local_a8,dest);
  }
  else {
    fio_ltocstr(&local_a8,lVar10);
  }
LAB_0016245d:
  pcVar13 = local_68.data;
  local_88.data = local_a8.data;
  local_88.capa = CONCAT44(local_a8.capa._4_4_,(undefined4)local_a8.capa);
  size = CONCAT44(local_a8.len._4_4_,(undefined4)local_a8.len);
  uVar12 = CONCAT44(local_68.len._4_4_,(undefined4)local_68.len);
  local_88.len = size;
  uVar4 = fiobj_str_capa(dest);
  sVar11 = size + CONCAT44(local_68.len._4_4_,(undefined4)local_68.len) + 0x40;
  if (sVar11 < uVar4) goto LAB_0016257f;
  uVar4 = fiobj_str_capa_assert(dest,sVar11);
  if (dest == 0) {
LAB_00162555:
    local_a8.data = anon_var_dwarf_20c;
    local_a8.len._0_4_ = 4;
    goto LAB_00162568;
  }
  if ((dest & 1) == 0) {
    switch(uVar7 & 6) {
    case 0:
      cVar3 = *(char *)(dest & 0xfffffffffffffff8);
LAB_001624d7:
      switch(cVar3) {
      case '\'':
        pfVar6 = &FIOBJECT_VTABLE_FLOAT;
        break;
      case '(':
        goto switchD_001624cc_caseD_2;
      case ')':
        pfVar6 = &FIOBJECT_VTABLE_ARRAY;
        break;
      case '*':
        goto switchD_001624cc_caseD_4;
      case '+':
        pfVar6 = &FIOBJECT_VTABLE_DATA;
        break;
      default:
        pfVar6 = &FIOBJECT_VTABLE_NUMBER;
      }
      break;
    case 2:
switchD_001624cc_caseD_2:
      pfVar6 = &FIOBJECT_VTABLE_STRING;
      break;
    case 4:
switchD_001624cc_caseD_4:
      pfVar6 = &FIOBJECT_VTABLE_HASH;
      break;
    case 6:
      if (cVar9 == '&') {
        local_a8.data = anon_var_dwarf_217;
        local_a8.len._0_4_ = 5;
      }
      else {
        if ((uVar7 & 0xff) != 0x16) {
          cVar3 = cVar9;
          if ((uVar7 & 0xff) == 6) goto LAB_00162555;
          goto LAB_001624d7;
        }
        local_a8.data = anon_var_dwarf_222;
        local_a8.len._0_4_ = 4;
      }
LAB_00162568:
      local_a8.capa._0_4_ = 0;
      local_a8.capa._4_4_ = 0;
      local_a8.len._4_4_ = 0;
      goto LAB_0016256c;
    }
    (*pfVar6->to_str)(&local_a8,dest);
  }
  else {
    fio_ltocstr(&local_a8,lVar10);
  }
LAB_0016256c:
  local_88.data = local_a8.data;
  local_88.capa = CONCAT44(local_a8.capa._4_4_,(undefined4)local_a8.capa);
  local_88.len = CONCAT44(local_a8.len._4_4_,(undefined4)local_a8.len);
LAB_0016257f:
  if (uVar12 != 0) {
    local_40 = (ulong)(uVar7 & 6);
    local_48 = (char *)(dest & 0xfffffffffffffff8);
    uVar5 = 0;
    sVar11 = size;
    local_38 = lVar10;
    do {
      uVar14 = 0;
      while (bVar2 = pcVar13[uVar14], 0x20 < bVar2) {
        if ((bVar2 == 0x22) || (bVar2 == 0x5c)) {
          local_88.data[sVar11 + uVar14] = '\\';
          local_88.data[sVar11 + uVar14 + 1] = pcVar13[uVar14];
          goto LAB_001626bc;
        }
        local_88.data[uVar14 + sVar11] = bVar2;
        uVar14 = uVar14 + 1;
        if (uVar12 == uVar14) {
          size = sVar11 + uVar14;
          goto LAB_00162821;
        }
      }
      switch(bVar2) {
      case 8:
        (local_88.data + sVar11 + uVar14)[0] = '\\';
        (local_88.data + sVar11 + uVar14)[1] = 'b';
        break;
      case 9:
        (local_88.data + sVar11 + uVar14)[0] = '\\';
        (local_88.data + sVar11 + uVar14)[1] = 't';
        break;
      case 10:
        (local_88.data + sVar11 + uVar14)[0] = '\\';
        (local_88.data + sVar11 + uVar14)[1] = 'n';
        break;
      case 0xb:
switchD_0016261a_caseD_b:
        lVar10 = sVar11 + uVar14;
        pcVar1 = local_88.data + lVar10;
        pcVar1[0] = '\\';
        pcVar1[1] = 'u';
        pcVar1[2] = '0';
        pcVar1[3] = '0';
        local_88.data[lVar10 + 4] = "0123456789ABCDEF"[(byte)pcVar13[uVar14] >> 4];
        size = sVar11 + uVar14 + 6;
        local_88.data[lVar10 + 5] = "0123456789ABCDEF"[(byte)pcVar13[uVar14] & 0xf];
        uVar5 = uVar5 + 4;
        goto LAB_001626bf;
      case 0xc:
        (local_88.data + sVar11 + uVar14)[0] = '\\';
        (local_88.data + sVar11 + uVar14)[1] = 'f';
        break;
      case 0xd:
        (local_88.data + sVar11 + uVar14)[0] = '\\';
        (local_88.data + sVar11 + uVar14)[1] = 'r';
        break;
      default:
        if (bVar2 != 0x20) goto switchD_0016261a_caseD_b;
        size = sVar11 + uVar14 + 1;
        local_88.data[sVar11 + uVar14] = ' ';
        goto LAB_001626bf;
      }
LAB_001626bc:
      size = sVar11 + uVar14 + 2;
      uVar5 = uVar5 + 1;
LAB_001626bf:
      if ((0x2f < uVar5) && (uVar8 = ((size + uVar12) - uVar14) + 0x3f, uVar4 <= uVar8)) {
        local_88.data[size] = '\0';
        fiobj_str_resize(dest,size);
        fiobj_str_capa_assert(dest,uVar8);
        if (dest == 0) {
LAB_0016278b:
          local_a8.data = anon_var_dwarf_20c;
          local_a8.len._0_4_ = 4;
          goto LAB_0016279e;
        }
        if ((dest & 1) == 0) {
          switch((long)&switchD_00162719::switchdataD_00171c0c +
                 (long)(int)(&switchD_00162719::switchdataD_00171c0c)[local_40]) {
          case 0x16271b:
            cVar3 = *local_48;
LAB_00162722:
            pfVar6 = &FIOBJECT_VTABLE_NUMBER;
            switch(cVar3) {
            case '\'':
              pfVar6 = &FIOBJECT_VTABLE_FLOAT;
              break;
            case '(':
              goto switchD_00162719_caseD_162765;
            case ')':
              pfVar6 = &FIOBJECT_VTABLE_ARRAY;
              break;
            case '*':
              goto switchD_00162719_caseD_16275c;
            case '+':
              pfVar6 = &FIOBJECT_VTABLE_DATA;
            }
            break;
          case 0x16275c:
switchD_00162719_caseD_16275c:
            pfVar6 = &FIOBJECT_VTABLE_HASH;
            break;
          case 0x162765:
switchD_00162719_caseD_162765:
            pfVar6 = &FIOBJECT_VTABLE_STRING;
            break;
          case 0x162777:
            if (cVar9 == '&') {
              local_a8.data = anon_var_dwarf_217;
              local_a8.len._0_4_ = 5;
            }
            else {
              if ((uVar7 & 0xff) != 0x16) {
                cVar3 = cVar9;
                if ((uVar7 & 0xff) == 6) goto LAB_0016278b;
                goto LAB_00162722;
              }
              local_a8.data = anon_var_dwarf_222;
              local_a8.len._0_4_ = 4;
            }
LAB_0016279e:
            local_a8.capa._0_4_ = 0;
            local_a8.capa._4_4_ = 0;
            local_a8.len._4_4_ = 0;
            goto LAB_001627a2;
          }
          (*pfVar6->to_str)(&local_a8,dest);
        }
        else {
          fio_ltocstr(&local_a8,local_38);
        }
LAB_001627a2:
        local_88.data = local_a8.data;
        uVar4 = CONCAT44(local_a8.capa._4_4_,(undefined4)local_a8.capa);
        local_88.len = CONCAT44(local_a8.len._4_4_,(undefined4)local_a8.len);
        uVar5 = 0;
        local_88.capa = uVar4;
      }
      pcVar13 = pcVar13 + uVar14 + 1;
      uVar8 = uVar12 - 1;
      uVar12 = ~uVar14 + uVar12;
      sVar11 = size;
    } while (uVar8 != uVar14);
  }
LAB_00162821:
  local_88.data[size] = '\"';
  fiobj_str_resize(dest,size + 1);
  return;
}

Assistant:

static void write_safe_str(FIOBJ dest, const FIOBJ str) {
  fio_str_info_s s = fiobj_obj2cstr(str);
  fio_str_info_s t = fiobj_obj2cstr(dest);
  t.data[t.len] = '"';
  t.len++;
  fiobj_str_resize(dest, t.len);
  t = fiobj_obj2cstr(dest);
  const uint8_t *restrict src = (const uint8_t *)s.data;
  size_t len = s.len;
  uint64_t end = t.len;
  /* make sure we have some room */
  size_t added = 0;
  size_t capa = fiobj_str_capa(dest);
  if (capa <= end + s.len + 64) {
    if (0) {
      capa = (((capa >> 12) + 1) << 12) - 1;
      capa = fiobj_str_capa_assert(dest, capa);
    } else {
      capa = fiobj_str_capa_assert(dest, (end + s.len + 64));
    }
    fio_str_info_s tmp = fiobj_obj2cstr(dest);
    t = tmp;
  }
  while (len) {
    char *restrict writer = (char *)t.data;
    while (len && src[0] > 32 && src[0] != '"' && src[0] != '\\') {
      len--;
      writer[end++] = *(src++);
    }
    if (!len)
      break;
    switch (src[0]) {
    case '\b':
      writer[end++] = '\\';
      writer[end++] = 'b';
      added++;
      break; /* from switch */
    case '\f':
      writer[end++] = '\\';
      writer[end++] = 'f';
      added++;
      break; /* from switch */
    case '\n':
      writer[end++] = '\\';
      writer[end++] = 'n';
      added++;
      break; /* from switch */
    case '\r':
      writer[end++] = '\\';
      writer[end++] = 'r';
      added++;
      break; /* from switch */
    case '\t':
      writer[end++] = '\\';
      writer[end++] = 't';
      added++;
      break; /* from switch */
    case '"':
    case '\\':
    case '/':
      writer[end++] = '\\';
      writer[end++] = src[0];
      added++;
      break; /* from switch */
    default:
      if (src[0] <= 31) {
        /* MUST escape all control values less than 32 */
        writer[end++] = '\\';
        writer[end++] = 'u';
        writer[end++] = '0';
        writer[end++] = '0';
        writer[end++] = hex_chars[src[0] >> 4];
        writer[end++] = hex_chars[src[0] & 15];
        added += 4;
      } else
        writer[end++] = src[0];
      break; /* from switch */
    }
    src++;
    len--;
    if (added >= 48 && capa <= end + len + 64) {
      writer[end] = 0;
      fiobj_str_resize(dest, end);
      fiobj_str_capa_assert(dest, (end + len + 64));
      t = fiobj_obj2cstr(dest);
      writer = (char *)t.data;
      capa = t.capa;
      added = 0;
    }
  }
  t.data[end++] = '"';
  fiobj_str_resize(dest, end);
}